

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::rowDualBoundsDominatedColumns(HPresolve *this)

{
  double *pdVar1;
  int j;
  _List_node_base *p_Var2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  ostream *poVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  p_Var2 = (this->singCol).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)&this->singCol) {
      return;
    }
    j = *(int *)&p_Var2[1]._M_next;
    uVar9 = (ulong)j;
    piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = uVar9;
    if ((ulong)((long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar9)
    goto LAB_0013fa96;
    if (piVar3[uVar9] != 0) {
      iVar6 = getSingColElementIndexInA(this,j);
      uVar10 = (ulong)iVar6;
      piVar3 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar10;
      if ((ulong)((long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar10)
      goto LAB_0013fa96;
      iVar6 = piVar3[uVar10];
      uVar12 = (ulong)iVar6;
      piVar3 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar12;
      if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar12)
      goto LAB_0013fa96;
      if (piVar3[uVar12] == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: column singleton ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,j);
        poVar7 = std::operator<<(poVar7," is in row ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        std::operator<<(poVar7," which is already mapped off\n");
        exit(-1);
      }
      pdVar4 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar9;
      if ((ulong)((long)(this->super_HPreData).colLower.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9)
      goto LAB_0013fa96;
      dVar14 = pdVar4[uVar9];
      if ((dVar14 != -1e+200) || (NAN(dVar14))) {
        pdVar4 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9)
        goto LAB_0013fa96;
        dVar13 = pdVar4[uVar9];
        if ((dVar13 != 1e+200) || (NAN(dVar13))) goto LAB_0013fa60;
      }
      if (dVar14 <= -1e+200) {
LAB_0013f81e:
        if ((dVar14 == -1e+200) && (!NAN(dVar14))) {
          pdVar4 = (this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colUpper.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9)
          goto LAB_0013fa96;
          dVar14 = pdVar4[uVar9];
          if (1e+200 <= dVar14) {
            if ((dVar14 == 1e+200) && (!NAN(dVar14))) {
              pdVar4 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9) ||
                 ((pdVar8 = (this->super_HPreData).Avalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start, uVar11 = uVar10,
                  (ulong)((long)(this->super_HPreData).Avalue.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar10 ||
                  (pdVar5 = (this->implRowDualLower).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start, uVar11 = uVar12,
                  (ulong)((long)(this->implRowDualLower).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12))))
              goto LAB_0013fa96;
              dVar14 = pdVar4[uVar9] / pdVar8[uVar10];
              if (pdVar5[uVar12] <= dVar14 && dVar14 != pdVar5[uVar12]) {
                pdVar5[uVar12] = dVar14;
                dVar14 = pdVar4[uVar9] / pdVar8[uVar10];
              }
              pdVar4 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->implRowDualUpper).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar12)
              goto LAB_0013fa96;
              if (dVar14 < pdVar4[uVar12]) {
                pdVar4[uVar12] = dVar14;
              }
            }
          }
          else {
            pdVar4 = (this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = uVar10;
            if ((ulong)((long)(this->super_HPreData).Avalue.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar10)
            goto LAB_0013fa96;
            dVar14 = pdVar4[uVar10];
            if (0.0 < dVar14) {
              pdVar8 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar11 = uVar9;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar9) ||
                 (pdVar5 = (this->implRowDualLower).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start, uVar11 = uVar12,
                 (ulong)((long)(this->implRowDualLower).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12))
              goto LAB_0013fa96;
              dVar13 = pdVar8[uVar9];
              dVar15 = dVar13 / dVar14;
              pdVar1 = pdVar5 + uVar12;
              if (*pdVar1 <= dVar15 && dVar15 != *pdVar1) {
                pdVar8 = (this->implRowDualUpper).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->implRowDualUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar12)
                goto LAB_0013fa96;
                pdVar8[uVar12] = -dVar13 / dVar14;
                dVar14 = pdVar4[uVar10];
              }
            }
            if (dVar14 < 0.0) {
              pdVar4 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar11 = uVar9;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9) ||
                 (pdVar8 = (this->implRowDualUpper).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start, uVar11 = uVar12,
                 (ulong)((long)(this->implRowDualUpper).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar12))
              goto LAB_0013fa96;
              dVar14 = pdVar4[uVar9] / dVar14;
              if (dVar14 < pdVar8[uVar12]) goto LAB_0013f963;
            }
          }
        }
      }
      else {
        pdVar4 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9)
        goto LAB_0013fa96;
        dVar13 = pdVar4[uVar9];
        if ((dVar13 != 1e+200) || (NAN(dVar13))) goto LAB_0013f81e;
        pdVar4 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = uVar10;
        if ((ulong)((long)(this->super_HPreData).Avalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar10)
        goto LAB_0013fa96;
        dVar14 = pdVar4[uVar10];
        if (0.0 < dVar14) {
          pdVar8 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = uVar9;
          if (((ulong)((long)(this->super_HPreData).colCost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar9) ||
             (pdVar5 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, uVar11 = uVar12,
             (ulong)((long)(this->implRowDualUpper).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12))
          goto LAB_0013fa96;
          dVar13 = pdVar8[uVar9] / dVar14;
          if (dVar13 < pdVar5[uVar12]) {
            pdVar5[uVar12] = dVar13;
            dVar14 = pdVar4[uVar10];
          }
        }
        if (dVar14 < 0.0) {
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = uVar9;
          if (((ulong)((long)(this->super_HPreData).colCost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar9) ||
             (pdVar8 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, uVar11 = uVar12,
             (ulong)((long)(this->implRowDualLower).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar12))
          goto LAB_0013fa96;
          dVar14 = pdVar4[uVar9] / dVar14;
          if (dVar14 < pdVar8[uVar12] || dVar14 == pdVar8[uVar12]) goto LAB_0013fa1a;
LAB_0013f963:
          pdVar8[uVar12] = dVar14;
        }
      }
LAB_0013fa1a:
      pdVar4 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar12;
      if (((ulong)((long)(this->implRowDualLower).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar12) ||
         (pdVar8 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (ulong)((long)(this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <= uVar12)) {
LAB_0013fa96:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      dVar14 = pdVar4[uVar12];
      pdVar1 = pdVar8 + uVar12;
      if (*pdVar1 <= dVar14 && dVar14 != *pdVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "Error: inconstistent bounds for Lagrange multiplier for row ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        poVar7 = std::operator<<(poVar7," detected after column singleton ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,j);
        poVar7 = std::operator<<(poVar7,". In presolve::dominatedColumns");
        std::endl<char,std::char_traits<char>>(poVar7);
        exit(0);
      }
    }
LAB_0013fa60:
    p_Var2 = p_Var2->_M_next;
  } while( true );
}

Assistant:

void HPresolve::rowDualBoundsDominatedColumns() {
	int col, i, k;

	//for each row calc yihat and yibar and store in implRowDualLower and implRowDualUpper
	for (list<int>::iterator it = singCol.begin(); it != singCol.end(); ++it)
		if (flagCol.at(*it)) {
			col = *it;
			k = getSingColElementIndexInA(col);
			i = Aindex.at(k);

			if (!flagRow.at(i)) {
				cout<<"ERROR: column singleton "<<col<<" is in row "<<i<<" which is already mapped off\n";
				exit(-1);
			}

			if (colLower.at(col) == -HSOL_CONST_INF || colUpper.at(col) == HSOL_CONST_INF) {

				if (colLower.at(col) > -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF)  {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) < HSOL_CONST_INF) {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualUpper.at(i) = -colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF) {
					//all should be removed earlier but use them
					if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
					if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}

				if (implRowDualLower.at(i) > implRowDualUpper.at(i)) {
					cout<<"Error: inconstistent bounds for Lagrange multiplier for row "<< i<< " detected after column singleton "<<col<<". In presolve::dominatedColumns"<<endl;
					exit(0);
				}
			}
		}

}